

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O0

void cvode_emit_interface(void)

{
  Symbol *s_00;
  uint uVar1;
  List *pLVar2;
  int sindex;
  Symbol *s;
  int i;
  Item *q1;
  Item *q;
  List *lst;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffe4;
  undefined8 in_stack_fffffffffffffff0;
  int block;
  Item *pIVar3;
  
  block = (int)((ulong)in_stack_fffffffffffffff0 >> 0x20);
  if (cvode_not_allowed == 0) {
    if (cvode_emit != 0) {
      lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      sprintf(buf,"\nstatic int _ode_count(int _type){ return %d;}\n",(ulong)(uint)cvode_neq_);
      lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      sprintf(buf,"\n#define _cvode_ieq _ppvar[%d]._i\n",(ulong)(uint)cvode_ieq_index);
      lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if (cvode_fun_->subtype == 0x80) {
        cvode_proced_emit();
      }
      else {
        lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        out_nt_ml_frag((List *)0x10bf12);
        pLVar2 = get_ion_variables(in_stack_ffffffffffffffd4);
        if (pLVar2->next->itemtype != 0) {
          movelist((Item *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (Item *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   (List *)0x10bf53);
        }
        sprintf(buf,"    _ode_spec%d",(ulong)(uint)cvode_num_);
        lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        vectorize_substitute
                  ((Item *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        pLVar2 = set_ion_variables(block);
        if (pLVar2->next->itemtype != 0) {
          movelist((Item *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (Item *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   (List *)0x10bff0);
        }
        lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        vectorize_substitute
                  ((Item *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        sprintf(buf,
                "\tint _i; _p = _pp; _ppvar = _ppd;\n\t_cvode_ieq = _ieq;\n\tfor (_i=0; _i < %d; ++_i) {\n\t\t_pv[_i] = _pp + _slist%d[_i];  _pvdot[_i] = _pp + _dlist%d[_i];\n\t\t_cvode_abstol(_atollist, _atol, _i);\n\t}\n"
                ,(ulong)(uint)cvode_neq_,(ulong)(uint)cvode_num_,(ulong)(uint)cvode_num_);
        lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        cvode_conc_map();
        lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        if (ion_synonym != (List *)0x0) {
          lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
          lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
          lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
          vectorize_substitute
                    ((Item *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
          lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
          movelist((Item *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (Item *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   (List *)0x10c149);
          lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        out_nt_ml_frag((List *)0x10c188);
        pLVar2 = get_ion_variables(in_stack_ffffffffffffffd4);
        if (pLVar2->next->itemtype != 0) {
          movelist((Item *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (Item *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   (List *)0x10c1c9);
        }
        if (cvode_fun_->subtype == 0x400) {
          in_stack_ffffffffffffffc8 = cvode_num_;
          in_stack_ffffffffffffffe4 = cvode_num_;
          sprintf(buf,"_cvode_sparse(&_cvsparseobj%d, %d, _dlist%d, _p, _ode_matsol%d, &_coef%d);\n"
                  ,(ulong)(uint)cvode_num_,(ulong)(uint)cvode_neq_,(ulong)(uint)cvode_num_,
                  (ulong)(uint)cvode_num_);
          lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
          sprintf(buf,
                  "_cvode_sparse_thread(&_thread[_cvspth%d]._pvoid, %d, _dlist%d, _p, _ode_matsol%d, _ppvar, _thread, _nt);\n"
                  ,(ulong)in_stack_ffffffffffffffe4,(ulong)(uint)cvode_neq_,
                  (ulong)in_stack_ffffffffffffffe4,(ulong)in_stack_ffffffffffffffe4);
          vectorize_substitute
                    ((Item *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        else {
          sprintf(buf,"_ode_matsol%d",(ulong)(uint)cvode_num_);
          lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
          lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
          vectorize_substitute
                    ((Item *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      if (state_discon_list_ != (List *)0x0) {
        for (pIVar3 = state_discon_list_->next; pIVar3 != state_discon_list_; pIVar3 = pIVar3->next)
        {
          s_00 = (Symbol *)((pIVar3->element).sym)->subtype;
          if ((((pIVar3->element).sym)->type == 1) && ((s_00->subtype & 0x10U) != 0)) {
            uVar1 = slist_search(in_stack_ffffffffffffffe4,s_00);
            sprintf(buf,"_cvode_ieq + %d, &",(ulong)uVar1);
            replacstr((Item *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                      (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
          }
        }
      }
    }
  }
  else {
    lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    sprintf(buf,
            "\nstatic int _ode_count(int _type){ hoc_execerror(\"%s\", \"cannot be used with CVODE\"); return 0;}\n"
            ,mechname);
    lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  return;
}

Assistant:

void cvode_emit_interface() {
	List* lst;
	Item* q, *q1;
	if (cvode_not_allowed) {
		Lappendstr(defs_list, "\n\
static int _ode_count(int);\n");
		sprintf(buf, "\n\
static int _ode_count(int _type){ hoc_execerror(\"%s\", \"cannot be used with CVODE\"); return 0;}\n",
			mechname);
		Lappendstr(procfunc, buf);
	}else if (cvode_emit) {

		Lappendstr(defs_list, "\n\
static int _ode_count(int);\n\
static void _ode_map(int, double**, double**, double*, Datum*, double*, int);\n\
static void _ode_spec(NrnThread*, Memb_list*, int);\n\
static void _ode_matsol(NrnThread*, Memb_list*, int);\n\
");
		sprintf(buf, "\n\
static int _ode_count(int _type){ return %d;}\n",
			cvode_neq_);
		Lappendstr(procfunc, buf);
		sprintf(buf, "\n#define _cvode_ieq _ppvar[%d]._i\n",cvode_ieq_index);
		Lappendstr(defs_list, buf);

   if (cvode_fun_->subtype == PROCED) {
	cvode_proced_emit();
   }else{
		Lappendstr(procfunc, "\nstatic void _ode_spec(NrnThread* _nt, Memb_list* _ml, int _type) {\n");
		out_nt_ml_frag(procfunc);
		lst = get_ion_variables(1);
		if (lst->next->itemtype) movelist(lst->next, lst->prev, procfunc);
		sprintf(buf,"    _ode_spec%d", cvode_num_);
		Lappendstr(procfunc, buf);
		vectorize_substitute(lappendstr(procfunc, "();\n"), "(_threadargs_);\n");
		lst = set_ion_variables(1);
		if (lst->next->itemtype) movelist(lst->next, lst->prev, procfunc);
		Lappendstr(procfunc, "}}\n");

		Lappendstr(procfunc, "\n\
static void _ode_map(int _ieq, double** _pv, double** _pvdot, double* _pp, Datum* _ppd, double* _atol, int _type) {");
		vectorize_substitute(lappendstr(procfunc, "\n"), "\n\
	double* _p; Datum* _ppvar;\n");
		sprintf(buf, "\
	int _i; _p = _pp; _ppvar = _ppd;\n\
	_cvode_ieq = _ieq;\n\
	for (_i=0; _i < %d; ++_i) {\n\
		_pv[_i] = _pp + _slist%d[_i];  _pvdot[_i] = _pp + _dlist%d[_i];\n\
		_cvode_abstol(_atollist, _atol, _i);\n\
	}\n",
			cvode_neq_, cvode_num_, cvode_num_);
		Lappendstr(procfunc, buf);
/* need to take care of case where a state is an ion concentration. Replace
the _pp pointer with a pointer to the actual ion model's concentration */
		cvode_conc_map();
		Lappendstr(procfunc, "}\n"); 
		if (ion_synonym) {
			Lappendstr(defs_list, "static void _ode_synonym(int, double**, Datum**);\n");
			Lappendstr(procfunc, "\
static void _ode_synonym(int _cnt, double** _pp, Datum** _ppd) {");
		vectorize_substitute(lappendstr(procfunc, "\n"), "\n\
	double* _p; Datum* _ppvar;\n");
			Lappendstr(procfunc, "\
	int _i; \n\
	for (_i=0; _i < _cnt; ++_i) {_p = _pp[_i]; _ppvar = _ppd[_i];\n");
			movelist(ion_synonym->next, ion_synonym->prev, procfunc);
			Lappendstr(procfunc, "}}\n");
		}

		Lappendstr(procfunc, "\nstatic void _ode_matsol(NrnThread* _nt, Memb_list* _ml, int _type) {\n");
		out_nt_ml_frag(procfunc);
		lst = get_ion_variables(1);
		if (lst->next->itemtype) movelist(lst->next, lst->prev, procfunc);
		if (cvode_fun_->subtype == KINF) {
			int i = cvode_num_;
sprintf(buf, "_cvode_sparse(&_cvsparseobj%d, %d, _dlist%d, _p, _ode_matsol%d, &_coef%d);\n",
				i, cvode_neq_, i, i, i);
			Lappendstr(procfunc, buf);
sprintf(buf, "_cvode_sparse_thread(&_thread[_cvspth%d]._pvoid, %d, _dlist%d, _p, _ode_matsol%d, _ppvar, _thread, _nt);\n",
				i, cvode_neq_, i, i);
			vectorize_substitute(procfunc->prev, buf);
			
		}else{
			sprintf(buf, "_ode_matsol%d", cvode_num_);
			Lappendstr(procfunc, buf);
			vectorize_substitute(lappendstr(procfunc, "();\n"), "(_threadargs_);\n");
		}
		Lappendstr(procfunc, "}}\n");
	}
	/* handle the state_discontinuities */
	if (state_discon_list_) ITERATE(q, state_discon_list_) {
		Symbol* s;
		int sindex;
		q1 = ITM(q);
		s = SYM(q1);
		if (q1->itemtype == SYMBOL && (s->subtype & STAT)) {
			sindex = slist_search(cvode_num_, s);
			sprintf(buf, "_cvode_ieq + %d, &", sindex);
			replacstr(q1->prev, buf);
		}
	}
   }
}